

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::FinishTransferSwept(Recycler *this,CollectionFlags flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclerSweepManager *this_00;
  
  if ((this->collectionState).value != CollectionStateTransferSweptWait) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1794,"(collectionState == CollectionStateTransferSweptWait)",
                       "collectionState == CollectionStateTransferSweptWait");
    if (!bVar2) goto LAB_006866d6;
    *puVar3 = 0;
  }
  PrintCollectTrace(this,ConcurrentSweepPhase,true,false);
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateTransferSwept);
  if (DAT_0145c440 == '\x01') {
    bVar2 = HeapInfoManager::HasZeroQueuedPages(&this->autoHeap);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x179e,"(!autoHeap.HasZeroQueuedPages())","!autoHeap.HasZeroQueuedPages()"
                        );
      if (!bVar2) goto LAB_006866d6;
      *puVar3 = 0;
    }
    HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
  }
  this_00 = this->recyclerSweepManager;
  if (this_00 == (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a6,"(this->recyclerSweepManager != nullptr)",
                       "this->recyclerSweepManager != nullptr");
    if (!bVar2) goto LAB_006866d6;
    *puVar3 = 0;
    this_00 = this->recyclerSweepManager;
  }
  bVar2 = RecyclerSweepManager::IsBackground(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a7,"(!this->recyclerSweepManager->IsBackground())",
                       "!this->recyclerSweepManager->IsBackground()");
    if (!bVar2) {
LAB_006866d6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->inPartialCollectMode == true) {
    ConcurrentPartialTransferSweptObjects(this,this->recyclerSweepManager);
  }
  else {
    ConcurrentTransferSweptObjects(this,this->recyclerSweepManager);
  }
  RecyclerSweepManager::EndSweep(this->recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::FinishTransferSwept(CollectionFlags flags)
{
    GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
    GCETW(GC_FLUSHZEROPAGE_START, (this));

    Assert(collectionState == CollectionStateTransferSweptWait);
#ifdef RECYCLER_TRACE
    PrintCollectTrace(Js::ConcurrentSweepPhase, true);
#endif
    SetCollectionState(CollectionStateTransferSwept);

#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We should have zeroed all the pages in the background thread
        Assert(!autoHeap.HasZeroQueuedPages());
        autoHeap.FlushBackgroundPages();
    }
#endif

    GCETW(GC_FLUSHZEROPAGE_STOP, (this));
    GCETW(GC_TRANSFERSWEPTOBJECTS_START, (this));

    Assert(this->recyclerSweepManager != nullptr);
    Assert(!this->recyclerSweepManager->IsBackground());
#if ENABLE_PARTIAL_GC
    if (this->inPartialCollectMode)
    {
        ConcurrentPartialTransferSweptObjects(*this->recyclerSweepManager);
    }
    else
#endif
    {
        ConcurrentTransferSweptObjects(*this->recyclerSweepManager);
    }
    recyclerSweepManager->EndSweep();

    GCETW(GC_TRANSFERSWEPTOBJECTS_STOP, (this));

    GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
}